

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

void int_times(IntVar *x,IntVar *y,IntVar *z)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  IntView<0> _z;
  IntView<0> _z_00;
  IntView<0> _z_01;
  IntView<1> _z_02;
  IntView<1> _z_03;
  IntView<0> _z_04;
  TimesAll<0,_0,_0> *pTVar7;
  Times<0,_0,_0> *this;
  Times<0,_1,_1> *this_00;
  Times<1,_0,_1> *this_01;
  Times<1,_1,_0> *this_02;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  IntView<1> _x_03;
  IntView<1> _x_04;
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<0> _y_01;
  IntView<1> _y_02;
  IntView<0> _y_03;
  IntView<1> _y_04;
  
  iVar1 = (x->min).v;
  if ((((iVar1 < 0) && (0 < (x->max).v)) || ((iVar2 = (y->min).v, iVar2 < 0 && (0 < (y->max).v))))
     || ((iVar3 = (z->min).v, iVar3 < 0 && (0 < (z->max).v)))) {
    pTVar7 = (TimesAll<0,_0,_0> *)operator_new(0x48);
    _z.a = 1;
    _z.b = 0;
    _z.var = z;
    _x.a = 1;
    _x.b = 0;
    _x.var = x;
    _y.a = 1;
    _y.b = 0;
    _y.var = y;
    TimesAll<0,_0,_0>::TimesAll(pTVar7,_x,_y,_z);
  }
  else {
    if (iVar1 < 0) {
      bVar4 = (x->max).v < 1;
    }
    else {
      bVar4 = false;
    }
    if (iVar2 < 0) {
      bVar5 = (y->max).v < 1;
    }
    else {
      bVar5 = false;
    }
    if (iVar3 < 0) {
      bVar6 = (z->max).v < 1;
    }
    else {
      bVar6 = false;
    }
    if ((bVar4 || bVar5) || bVar6) {
      if ((bool)(bVar5 & bVar6) && !bVar4) {
        this_00 = (Times<0,_1,_1> *)operator_new(0x50);
        _z_02.a = 1;
        _z_02.b = 0;
        _z_02.var = z;
        _x_02.a = 1;
        _x_02.b = 0;
        _x_02.var = x;
        _y_02.a = 1;
        _y_02.b = 0;
        _y_02.var = y;
        Times<0,_1,_1>::Times(this_00,_x_02,_y_02,_z_02);
      }
      else if ((bool)(bVar4 & bVar6) && !bVar5) {
        this_01 = (Times<1,_0,_1> *)operator_new(0x50);
        _z_03.a = 1;
        _z_03.b = 0;
        _z_03.var = z;
        _x_03.a = 1;
        _x_03.b = 0;
        _x_03.var = x;
        _y_03.a = 1;
        _y_03.b = 0;
        _y_03.var = y;
        Times<1,_0,_1>::Times(this_01,_x_03,_y_03,_z_03);
      }
      else if (!bVar6 && (bool)(bVar4 & bVar5)) {
        this_02 = (Times<1,_1,_0> *)operator_new(0x50);
        _z_04.a = 1;
        _z_04.b = 0;
        _z_04.var = z;
        _x_04.a = 1;
        _x_04.b = 0;
        _x_04.var = x;
        _y_04.a = 1;
        _y_04.b = 0;
        _y_04.var = y;
        Times<1,_1,_0>::Times(this_02,_x_04,_y_04,_z_04);
      }
      else {
        pTVar7 = (TimesAll<0,_0,_0> *)operator_new(0x48);
        _z_00.a = 1;
        _z_00.b = 0;
        _z_00.var = z;
        _x_00.a = 1;
        _x_00.b = 0;
        _x_00.var = x;
        _y_00.a = 1;
        _y_00.b = 0;
        _y_00.var = y;
        TimesAll<0,_0,_0>::TimesAll(pTVar7,_x_00,_y_00,_z_00);
      }
    }
    else {
      this = (Times<0,_0,_0> *)operator_new(0x50);
      _z_01.a = 1;
      _z_01.b = 0;
      _z_01.var = z;
      _x_01.a = 1;
      _x_01.b = 0;
      _x_01.var = x;
      _y_01.a = 1;
      _y_01.b = 0;
      _y_01.var = y;
      Times<0,_0,_0>::Times(this,_x_01,_y_01,_z_01);
    }
  }
  return;
}

Assistant:

void int_times(IntVar* x, IntVar* y, IntVar* z) {
	if ((get_sign(x) == 0) || (get_sign(y) == 0) || (get_sign(z) == 0)) {
		new TimesAll<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
	} else {
		const bool x_flip = (get_sign(x) == -1);
		const bool y_flip = (get_sign(y) == -1);
		const bool z_flip = (get_sign(z) == -1);

		if (!x_flip && !y_flip && !z_flip) {
			new Times<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (!x_flip && y_flip && z_flip) {
			new Times<0, 1, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (x_flip && !y_flip && z_flip) {
			new Times<1, 0, 1>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else if (x_flip && y_flip && !z_flip) {
			new Times<1, 1, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		} else {
			new TimesAll<0, 0, 0>(IntView<>(x), IntView<>(y), IntView<>(z));
		}
	}
}